

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_cdef_mse_calc_frame_mt(AV1_COMP *cpi)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  AVxWorker *pAVar2;
  int iVar3;
  AVxWorkerInterface *pAVar4;
  long lVar5;
  EncWorkerData *pEVar6;
  int iVar7;
  void **ppvVar8;
  AVxWorker *pAVar9;
  ulong uVar10;
  long lVar11;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  uVar1 = (cpi->mt_info).num_mod_workers[6];
  uVar10 = (ulong)uVar1;
  __mutex = (cpi->mt_info).cdef_sync.mutex_;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  }
  *(undefined8 *)((long)&(cpi->mt_info).cdef_sync.fbr + 1) = 0;
  (cpi->mt_info).cdef_sync.end_of_frame = 0;
  (cpi->mt_info).cdef_sync.fbr = 0;
  if (0 < (int)uVar1) {
    lVar5 = uVar10 + 1;
    pEVar6 = (cpi->mt_info).tile_thr_data + uVar10;
    ppvVar8 = &(cpi->mt_info).workers[uVar10 - 1].data2;
    do {
      pEVar6 = pEVar6 + -1;
      pEVar6->cpi = cpi;
      ppvVar8[-2] = cdef_filter_block_worker_hook;
      ppvVar8[-1] = pEVar6;
      *ppvVar8 = &(cpi->mt_info).cdef_sync;
      lVar5 = lVar5 + -1;
      ppvVar8 = ppvVar8 + -7;
    } while (1 < lVar5);
  }
  pAVar4 = aom_get_worker_interface();
  if (0 < (int)uVar1) {
    lVar5 = uVar10 + 1;
    lVar11 = uVar10 * 0x38;
    do {
      pAVar9 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar9[-1].had_error + lVar11) = 0;
      pAVar9 = (AVxWorker *)((long)&pAVar9[-1].impl_ + lVar11);
      if (lVar5 == 2) {
        (*pAVar4->execute)(pAVar9);
      }
      else {
        (*pAVar4->launch)(pAVar9);
      }
      lVar5 = lVar5 + -1;
      lVar11 = lVar11 + -0x38;
    } while (1 < lVar5);
  }
  pAVar4 = aom_get_worker_interface();
  pAVar9 = (cpi->mt_info).workers;
  iVar7 = pAVar9->had_error;
  if (iVar7 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar9->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar1) {
    lVar11 = uVar10 + 1;
    lVar5 = uVar10 * 0x38;
    do {
      pAVar2 = (cpi->mt_info).workers;
      iVar3 = (*pAVar4->sync)((AVxWorker *)((long)&pAVar2[-1].impl_ + lVar5));
      if (iVar3 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar2[-1].data1 + lVar5) + 0x18),0x1a0);
        iVar7 = 1;
      }
      lVar11 = lVar11 + -1;
      lVar5 = lVar5 + -0x38;
    } while (2 < lVar11);
  }
  if (iVar7 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar9->data1 + 8) + 0x2b90) = (cpi->common).error;
  return;
}

Assistant:

void av1_cdef_mse_calc_frame_mt(AV1_COMP *cpi) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  AV1CdefSync *cdef_sync = &mt_info->cdef_sync;
  const int num_workers = mt_info->num_mod_workers[MOD_CDEF_SEARCH];

  cdef_reset_job_info(cdef_sync);
  prepare_cdef_workers(cpi, cdef_filter_block_worker_hook, num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, &cpi->common, num_workers);
}